

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

char * nlohmann::detail::
       lexer_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ::token_type_name(token_type t)

{
  char *pcStack_10;
  token_type t_local;
  
  switch(t) {
  case uninitialized:
    pcStack_10 = "<uninitialized>";
    break;
  case literal_true:
    pcStack_10 = "true literal";
    break;
  case literal_false:
    pcStack_10 = "false literal";
    break;
  case literal_null:
    pcStack_10 = "null literal";
    break;
  case value_string:
    pcStack_10 = "string literal";
    break;
  case value_unsigned:
  case value_integer:
  case value_float:
    pcStack_10 = "number literal";
    break;
  case begin_array:
    pcStack_10 = "\'[\'";
    break;
  case begin_object:
    pcStack_10 = "\'{\'";
    break;
  case end_array:
    pcStack_10 = "\']\'";
    break;
  case end_object:
    pcStack_10 = "\'}\'";
    break;
  case name_separator:
    pcStack_10 = "\':\'";
    break;
  case value_separator:
    pcStack_10 = "\',\'";
    break;
  case parse_error:
    pcStack_10 = "<parse error>";
    break;
  case end_of_input:
    pcStack_10 = "end of input";
    break;
  case literal_or_value:
    pcStack_10 = "\'[\', \'{\', or a literal";
    break;
  default:
    pcStack_10 = "unknown token";
  }
  return pcStack_10;
}

Assistant:

static const char* token_type_name(const token_type t) noexcept
{
switch (t)
{
case token_type::uninitialized:
return "<uninitialized>";
case token_type::literal_true:
return "true literal";
case token_type::literal_false:
return "false literal";
case token_type::literal_null:
return "null literal";
case token_type::value_string:
return "string literal";
case token_type::value_unsigned:
case token_type::value_integer:
case token_type::value_float:
return "number literal";
case token_type::begin_array:
return "'['";
case token_type::begin_object:
return "'{'";
case token_type::end_array:
return "']'";
case token_type::end_object:
return "'}'";
case token_type::name_separator:
return "':'";
case token_type::value_separator:
return "','";
case token_type::parse_error:
return "<parse error>";
case token_type::end_of_input:
return "end of input";
case token_type::literal_or_value:
return "'[', '{', or a literal";
// LCOV_EXCL_START
default: // catch non-enum values
return "unknown token";
// LCOV_EXCL_STOP
}
}